

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefineDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::MacroFormalArgumentListSyntax*&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,Token *args,Token *args_1,MacroFormalArgumentListSyntax **args_2,
          TokenList *args_3)

{
  MacroFormalArgumentListSyntax *pMVar1;
  Info *pIVar2;
  Info *pIVar3;
  SyntaxNode *pSVar4;
  size_t sVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  DefineDirectiveSyntax *pDVar15;
  
  pDVar15 = (DefineDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefineDirectiveSyntax *)this->endPtr < pDVar15 + 1) {
    pDVar15 = (DefineDirectiveSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pDVar15 + 1);
  }
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar2 = args->info;
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar3 = args_1->info;
  pMVar1 = *args_2;
  (pDVar15->super_DirectiveSyntax).super_SyntaxNode.kind = DefineDirective;
  (pDVar15->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar15->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pDVar15->super_DirectiveSyntax).directive.kind = TVar6;
  (pDVar15->super_DirectiveSyntax).directive.field_0x2 = uVar7;
  (pDVar15->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar8.raw;
  (pDVar15->super_DirectiveSyntax).directive.rawLen = uVar9;
  (pDVar15->super_DirectiveSyntax).directive.info = pIVar2;
  (pDVar15->name).kind = TVar10;
  (pDVar15->name).field_0x2 = uVar11;
  (pDVar15->name).numFlags = (NumericTokenFlags)NVar12.raw;
  (pDVar15->name).rawLen = uVar13;
  (pDVar15->name).info = pIVar3;
  pDVar15->formalArguments = pMVar1;
  (pDVar15->body).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_3->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar14 = *(undefined4 *)&(args_3->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (args_3->super_SyntaxListBase).super_SyntaxNode.parent;
  (pDVar15->body).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_3->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar15->body).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar14;
  (pDVar15->body).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (pDVar15->body).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (pDVar15->body).super_SyntaxListBase.childCount = (args_3->super_SyntaxListBase).childCount;
  sVar5 = (args_3->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (pDVar15->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args_3->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  (pDVar15->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar5;
  (pDVar15->body).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f7be8;
  if (pMVar1 != (MacroFormalArgumentListSyntax *)0x0) {
    (pMVar1->super_SyntaxNode).parent = (SyntaxNode *)pDVar15;
  }
  (pDVar15->body).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pDVar15;
  return pDVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }